

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf_pyr_height_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10d4d1e::GFPyrHeightTest_EncodeAndVerifyPSNR_Test::TestBody
          (GFPyrHeightTest_EncodeAndVerifyPSNR_Test *this)

{
  EncoderTest *pEVar1;
  int iVar2;
  bool bVar3;
  Message *pMVar4;
  SEARCH_METHODS *message;
  AssertHelper local_a0;
  AssertHelper local_98;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_a0);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,
             (this->super_GFPyrHeightTest).super_EncoderTest.cfg_.g_timebase.den,
             (this->super_GFPyrHeightTest).super_EncoderTest.cfg_.g_timebase.num,0,0x20);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_GFPyrHeightTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      iVar2 = (this->super_GFPyrHeightTest).nframes_;
      local_a0.data_ = (AssertHelperData *)0x0;
      if (iVar2 != 0) {
        local_a0.data_ = (AssertHelperData *)((this->super_GFPyrHeightTest).psnr_ / (double)iVar2);
      }
      local_98.data_ = (AssertHelperData *)(this->super_GFPyrHeightTest).psnr_threshold_;
      testing::internal::CmpHelperGT<double,double>
                ((internal *)&gtest_fatal_failure_checker,"GetAveragePsnr()","GetPsnrThreshold()",
                 (double *)&local_a0,(double *)&local_98);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a0);
        std::operator<<((ostream *)&(local_a0.data_)->line,"GF Min Pyramid Height = ");
        pMVar4 = testing::Message::operator<<
                           ((Message *)&local_a0,&(this->super_GFPyrHeightTest).gf_min_pyr_height_);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [3])0xa71392);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [25])"GF Max Pyramid Height = ");
        pMVar4 = testing::Message::operator<<
                           (pMVar4,&(this->super_GFPyrHeightTest).gf_max_pyr_height_);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/gf_pyr_height_test.cc"
                   ,0x93,(char *)message);
        testing::internal::AssertHelper::operator=(&local_98,pMVar4);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_005c36f0;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/gf_pyr_height_test.cc"
             ,0x92,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005c36f0:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(GFPyrHeightTest, EncodeAndVerifyPSNR) {
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 32);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  EXPECT_GT(GetAveragePsnr(), GetPsnrThreshold())
      << "GF Min Pyramid Height = " << gf_min_pyr_height_ << ", "
      << "GF Max Pyramid Height = " << gf_max_pyr_height_;
}